

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_revsurface.cpp
# Opt level: O0

bool __thiscall ON_RevSurface::IsSingular(ON_RevSurface *this,int side)

{
  ON_3dPoint local_80;
  ON_3dPoint local_68;
  double local_50;
  ON_3dPoint Q;
  ON_3dPoint P;
  bool rc;
  int side_local;
  ON_RevSurface *this_local;
  
  P.z._3_1_ = false;
  if ((side < 0) || (3 < side)) {
    this_local._7_1_ = false;
  }
  else {
    P.z._4_4_ = side;
    if ((this->m_bTransposed & 1U) != 0) {
      switch(side) {
      case 0:
        P.z._4_4_ = 3;
        break;
      case 1:
        P.z._4_4_ = 2;
        break;
      case 2:
        P.z._4_4_ = 1;
        break;
      case 3:
        P.z._4_4_ = 0;
      }
    }
    if ((P.z._4_4_ == 0) || (P.z._4_4_ == 2)) {
      if (P.z._4_4_ == 0) {
        ON_Curve::PointAtStart(&local_68,this->m_curve);
      }
      else {
        ON_Curve::PointAtEnd(&local_68,this->m_curve);
      }
      Q.z = local_68.x;
      ON_Line::ClosestPointTo(&local_80,&this->m_axis,(ON_3dPoint *)&Q.z);
      local_50 = local_80.x;
      Q.x = local_80.y;
      Q.y = local_80.z;
      P.z._3_1_ = ON_PointsAreCoincident(3,false,&Q.z,&local_50);
    }
    this_local._7_1_ = P.z._3_1_;
  }
  return this_local._7_1_;
}

Assistant:

bool ON_RevSurface::IsSingular( int side ) const // 0 = south, 1 = east, 2 = north, 3 = west
{
  bool rc = false;
  ON_3dPoint P, Q;
  //double d, tol;
  if ( side < 0 || side > 3 )
    return false;

  if ( m_bTransposed )
  {
    switch(side)
    {
    case 0: side = 3; break;
    case 1: side = 2; break;
    case 2: side = 1; break;
    case 3: side = 0; break;
    }
  }

  if ( 0 == side || 2 == side )
  {
    P = (0 == side)
      ? m_curve->PointAtStart()
      : m_curve->PointAtEnd();
    Q = m_axis.ClosestPointTo(P);

    // 26 Feb 2003 Dale Lear
    //
    //     I changed the code to handle cases when the
    //     "Q" has some coordinates that are small and
    //     other coordinates that are very large.  The
    //     fabs(Q.*)*ON_SQRT_EPSILON term is required
    //     in cases where the evaluations in PointAtStart()
    //     and/or ClosestPointTo() have more numerical 
    //     error than ON_ZERO_TOLERANCE.  The numerical
    //     tolerance term has to be calculated on a
    //     coordinate-by-coordinate basis.  See RR 9683.
    //
    // old test:
    //d = P.DistanceTo(Q);
    //if ( d <= ON_ZERO_TOLERANCE )
    //  rc = true;

    // 12 July 2012 Dale Lear
    //   Use ON_PointsAreCoincident() for all IsSingular queries
    //
    //d = fabs(P.x - Q.x);
    //tol = ON_ZERO_TOLERANCE + fabs(Q.x)*ON_SQRT_EPSILON;
    //if ( d <= tol )
    //{
    //  d = fabs(P.y - Q.y);
    //  tol = ON_ZERO_TOLERANCE + fabs(Q.y)*ON_SQRT_EPSILON;
    //  if ( d <= tol )
    //  {
    //    d = fabs(P.z - Q.z);
    //    tol = ON_ZERO_TOLERANCE + fabs(Q.z)*ON_SQRT_EPSILON;
    //    if ( d <= tol )
    //      rc = true;
    //  }
    //}
    rc = ON_PointsAreCoincident(3,0,&P.x,&Q.x);

  }

  return rc;
}